

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_ungzip(nhr_response r)

{
  size_t local_20;
  size_t decompressed_size;
  void *decompressed;
  nhr_response r_local;
  
  decompressed_size = 0;
  local_20 = 0;
  if ((r->body != (void *)0x0) && (r->body_len != 0)) {
    decompressed = r;
    if ((r->content_encoding & 1) == 0) {
      if ((r->content_encoding & 2) != 0) {
        decompressed_size = (size_t)nhr_gz_decompress(r->body,r->body_len,&local_20,'\0');
      }
    }
    else {
      decompressed_size = (size_t)nhr_gz_decompress(r->body,r->body_len,&local_20,'\x01');
    }
    if ((decompressed_size == 0) || (local_20 == 0)) {
      nhr_free((void *)decompressed_size);
    }
    else {
      nhr_free(*decompressed);
      *(size_t *)decompressed = decompressed_size;
      *(size_t *)((long)decompressed + 8) = local_20;
    }
  }
  return;
}

Assistant:

void nhr_response_ungzip(nhr_response r) {
	void * decompressed = NULL;
	size_t decompressed_size = 0;

	if (!r->body || r->body_len <= 0) {
		return;
	}
	
	if (r->content_encoding & NHR_CONTENT_ENCODING_GZIP) {
		decompressed = nhr_gz_decompress(r->body, r->body_len, &decompressed_size, NHR_GZ_METHOD_GZIP);
	} else if (r->content_encoding & NHR_CONTENT_ENCODING_DEFLATE) {
		decompressed = nhr_gz_decompress(r->body, r->body_len, &decompressed_size, NHR_GZ_METHOD_DEFLATE);
	}
	if (decompressed && decompressed_size > 0) {
		nhr_free(r->body);
		r->body = decompressed;
		r->body_len = decompressed_size;
	} else {
		nhr_free(decompressed);
	}
}